

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ini.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  sx_alloc *alloc_00;
  sx_ini *ini_00;
  char *pcVar2;
  char *pcVar3;
  int local_30;
  int local_2c;
  int k;
  int i;
  sx_ini *ini;
  sx_alloc *alloc;
  char **argv_local;
  int argc_local;
  
  alloc_00 = sx_alloc_malloc();
  ini_00 = sx_ini_load(ini_data,alloc_00);
  if (ini_00 == (sx_ini *)0x0) {
    puts("Loading ini data failed");
    argv_local._4_4_ = -1;
  }
  else {
    local_2c = 0;
    while( true ) {
      iVar1 = sx_ini_section_count(ini_00);
      if (iVar1 <= local_2c) break;
      pcVar2 = sx_ini_section_name(ini_00,local_2c);
      printf("Section: %s\n",pcVar2);
      local_30 = 0;
      while( true ) {
        iVar1 = sx_ini_property_count(ini_00,local_2c);
        if (iVar1 <= local_30) break;
        pcVar2 = sx_ini_property_name(ini_00,local_2c,local_30);
        pcVar3 = sx_ini_property_value(ini_00,local_2c,local_30);
        printf("\t%s = %s\n",pcVar2,pcVar3);
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_ini* ini = sx_ini_load(ini_data, alloc);
    if (!ini) {
        puts("Loading ini data failed");
        return -1;
    }

    for (int i = 0; i < sx_ini_section_count(ini); i++) {
        printf("Section: %s\n", sx_ini_section_name(ini, i));
        for (int k = 0; k < sx_ini_property_count(ini, i); k++) {
            printf("\t%s = %s\n", sx_ini_property_name(ini, i, k),
                   sx_ini_property_value(ini, i, k));
        }
    }

    return 0;
}